

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_st_atomic(DisasContext_conflict10 *ctx,MemOp_conflict memop)

{
  TCGContext_conflict10 *tcg_ctx;
  TCGv_i64 v1;
  ushort uVar1;
  uint32_t uVar2;
  TCGv_i64 EA;
  TCGv_i64 ret;
  TCGv_i64 val;
  TCGv_i64 val_00;
  TCGv_i64 ret_00;
  TCGv_i64 ret_01;
  TCGv_i64 ret_02;
  uintptr_t o;
  uintptr_t o_1;
  MemOp_conflict memop_00;
  uintptr_t o_2;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  uVar2 = ctx->opcode;
  EA = tcg_temp_new_i64(tcg_ctx);
  gen_addr_register(ctx,EA);
  v1 = *(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0x12 & 0xf8));
  ret = tcg_temp_new_i64(tcg_ctx);
  memop_00 = memop | MO_ALIGN;
  uVar1 = (ushort)uVar2 >> 0xb;
  switch(uVar1) {
  case 0:
    tcg_gen_atomic_add_fetch_i64_ppc64(tcg_ctx,ret,EA,v1,(long)ctx->mem_idx,memop_00);
    break;
  case 1:
    tcg_gen_atomic_xor_fetch_i64_ppc64(tcg_ctx,ret,EA,v1,(long)ctx->mem_idx,memop_00);
    break;
  case 2:
    tcg_gen_atomic_or_fetch_i64_ppc64(tcg_ctx,ret,EA,v1,(long)ctx->mem_idx,memop_00);
    break;
  case 3:
    tcg_gen_atomic_and_fetch_i64_ppc64(tcg_ctx,ret,EA,v1,(long)ctx->mem_idx,memop_00);
    break;
  case 4:
    tcg_gen_atomic_umax_fetch_i64_ppc64(tcg_ctx,ret,EA,v1,(long)ctx->mem_idx,memop_00);
    break;
  case 5:
    tcg_gen_atomic_smax_fetch_i64_ppc64(tcg_ctx,ret,EA,v1,(long)ctx->mem_idx,memop_00);
    break;
  case 6:
    tcg_gen_atomic_umin_fetch_i64_ppc64(tcg_ctx,ret,EA,v1,(long)ctx->mem_idx,memop_00);
    break;
  case 7:
    tcg_gen_atomic_smin_fetch_i64_ppc64(tcg_ctx,ret,EA,v1,(long)ctx->mem_idx,memop_00);
    break;
  default:
    if (uVar1 == 0x18) {
      if ((((ctx->base).tb)->cflags & 0x80000) == 0) {
        val = tcg_temp_new_i64(tcg_ctx);
        val_00 = tcg_temp_new_i64(tcg_ctx);
        ret_00 = tcg_temp_new_i64(tcg_ctx);
        ret_01 = tcg_temp_new_i64(tcg_ctx);
        ret_02 = tcg_temp_new_i64(tcg_ctx);
        tcg_gen_qemu_ld_i64_ppc64(tcg_ctx,val,EA,(long)ctx->mem_idx,memop_00);
        tcg_gen_addi_i64_ppc64(tcg_ctx,ret_02,EA,1L << ((byte)memop & 3));
        tcg_gen_qemu_ld_i64_ppc64(tcg_ctx,val_00,ret_02,(long)ctx->mem_idx,memop_00);
        tcg_gen_movcond_i64_ppc64(tcg_ctx,TCG_COND_EQ,ret_00,val,val_00,v1,val);
        tcg_gen_movcond_i64_ppc64(tcg_ctx,TCG_COND_EQ,ret_01,val,val_00,v1,val_00);
        tcg_gen_qemu_st_i64_ppc64(tcg_ctx,ret_00,EA,(long)ctx->mem_idx,memop_00);
        tcg_gen_qemu_st_i64_ppc64(tcg_ctx,ret_01,ret_02,(long)ctx->mem_idx,memop_00);
        tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(ret_02 + (long)tcg_ctx));
        tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(ret_01 + (long)tcg_ctx));
        tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
        tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(val_00 + (long)tcg_ctx));
        tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(val + (long)tcg_ctx));
      }
      else {
        gen_helper_exit_atomic(tcg_ctx,tcg_ctx->cpu_env);
        (ctx->base).is_jmp = DISAS_NORETURN;
      }
    }
    else {
      gen_exception_err(ctx,2,0x20);
    }
  }
  tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(EA + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_st_atomic(DisasContext *ctx, MemOp memop)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    uint32_t gpr_FC = FC(ctx->opcode);
    TCGv EA = tcg_temp_new(tcg_ctx);
    TCGv src, discard;

    gen_addr_register(ctx, EA);
    src = cpu_gpr[rD(ctx->opcode)];
    discard = tcg_temp_new(tcg_ctx);

    memop |= MO_ALIGN;
    switch (gpr_FC) {
    case 0: /* add and Store */
        tcg_gen_atomic_add_fetch_tl(tcg_ctx, discard, EA, src, ctx->mem_idx, memop);
        break;
    case 1: /* xor and Store */
        tcg_gen_atomic_xor_fetch_tl(tcg_ctx, discard, EA, src, ctx->mem_idx, memop);
        break;
    case 2: /* Or and Store */
        tcg_gen_atomic_or_fetch_tl(tcg_ctx, discard, EA, src, ctx->mem_idx, memop);
        break;
    case 3: /* 'and' and Store */
        tcg_gen_atomic_and_fetch_tl(tcg_ctx, discard, EA, src, ctx->mem_idx, memop);
        break;
    case 4:  /* Store max unsigned */
        tcg_gen_atomic_umax_fetch_tl(tcg_ctx, discard, EA, src, ctx->mem_idx, memop);
        break;
    case 5:  /* Store max signed */
        tcg_gen_atomic_smax_fetch_tl(tcg_ctx, discard, EA, src, ctx->mem_idx, memop);
        break;
    case 6:  /* Store min unsigned */
        tcg_gen_atomic_umin_fetch_tl(tcg_ctx, discard, EA, src, ctx->mem_idx, memop);
        break;
    case 7:  /* Store min signed */
        tcg_gen_atomic_smin_fetch_tl(tcg_ctx, discard, EA, src, ctx->mem_idx, memop);
        break;
    case 24: /* Store twin  */
        if (tb_cflags(ctx->base.tb) & CF_PARALLEL) {
            /* Restart with exclusive lock.  */
            gen_helper_exit_atomic(tcg_ctx, tcg_ctx->cpu_env);
            ctx->base.is_jmp = DISAS_NORETURN;
        } else {
            TCGv t = tcg_temp_new(tcg_ctx);
            TCGv t2 = tcg_temp_new(tcg_ctx);
            TCGv s = tcg_temp_new(tcg_ctx);
            TCGv s2 = tcg_temp_new(tcg_ctx);
            TCGv ea_plus_s = tcg_temp_new(tcg_ctx);

            tcg_gen_qemu_ld_tl(tcg_ctx, t, EA, ctx->mem_idx, memop);
            tcg_gen_addi_tl(tcg_ctx, ea_plus_s, EA, MEMOP_GET_SIZE(memop));
            tcg_gen_qemu_ld_tl(tcg_ctx, t2, ea_plus_s, ctx->mem_idx, memop);
            tcg_gen_movcond_tl(tcg_ctx, TCG_COND_EQ, s, t, t2, src, t);
            tcg_gen_movcond_tl(tcg_ctx, TCG_COND_EQ, s2, t, t2, src, t2);
            tcg_gen_qemu_st_tl(tcg_ctx, s, EA, ctx->mem_idx, memop);
            tcg_gen_qemu_st_tl(tcg_ctx, s2, ea_plus_s, ctx->mem_idx, memop);

            tcg_temp_free(tcg_ctx, ea_plus_s);
            tcg_temp_free(tcg_ctx, s2);
            tcg_temp_free(tcg_ctx, s);
            tcg_temp_free(tcg_ctx, t2);
            tcg_temp_free(tcg_ctx, t);
        }
        break;
    default:
        /* invoke data storage error handler */
        gen_exception_err(ctx, POWERPC_EXCP_DSI, POWERPC_EXCP_INVAL);
    }
    tcg_temp_free(tcg_ctx, discard);
    tcg_temp_free(tcg_ctx, EA);
}